

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_client.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::tools::DirectClient::DirectClient(DirectClient *this,string *host,int port)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  string local_68;
  long local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  (this->super_Client)._vptr_Client = (_func_int **)&PTR__DirectClient_001e8f98;
  (this->host_)._M_dataplus._M_p = (pointer)&(this->host_).field_2;
  (this->host_)._M_string_length = 0;
  (this->host_).field_2._M_local_buf[0] = '\0';
  OutputStreamImpl::OutputStreamImpl(&this->output_stream_,this);
  InputStreamImpl::InputStreamImpl(&this->input_stream_,this);
  if (Log == 0) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"DirectClient","");
    LoggerFactory::GetLogger((LoggerFactory *)&local_48,&local_68);
    p_Var1 = p_Stack_40;
    Log = local_48;
    this_00 = DAT_001eefd8;
    local_48 = 0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    DAT_001eefd8 = p_Var1;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::operator=((string *)&this->host_,(string *)host);
  this->port_ = port;
  return;
}

Assistant:

DirectClient::DirectClient(std::string host, int port) : output_stream_(OutputStreamImpl(*this)), input_stream_(InputStreamImpl(*this))
{
    if (Log == nullptr)
    {
        Log = LoggerFactory::GetLogger("DirectClient");
    }
    host_ = std::move(host);
    port_ = port;
}